

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool exrCheck(char *filename,bool reduceMemory,bool reduceTime,bool useStream,bool enableCoreCheck)

{
  bool bVar1;
  byte bVar2;
  streamoff sVar3;
  streamoff sVar4;
  char *pcVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  char *in_RDI;
  byte in_R8B;
  vector<char,_std::allocator<char>_> data;
  uintptr_t kMaxSize;
  streampos length;
  ifstream instream;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  fpos<__mbstate_t> *in_stack_fffffffffffffcd0;
  ostream *in_stack_fffffffffffffce0;
  size_type in_stack_fffffffffffffce8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  allocator<char> local_271 [25];
  fpos local_258 [16];
  undefined8 local_248;
  undefined1 local_240 [16];
  undefined4 local_230;
  long local_220 [65];
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  char *local_10;
  byte local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = in_CL & 1;
  local_14 = in_R8B & 1;
  if (local_13 == 0) {
    local_1 = Imf_3_4::checkOpenEXRFile(in_RDI,(bool)local_11,(bool)local_12,(bool)local_14);
    local_1 = local_1 & 1;
  }
  else {
    local_10 = in_RDI;
    std::ifstream::ifstream(local_220,in_RDI,_S_bin);
    bVar2 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::istream::seekg((long)local_220,_S_beg);
      local_240 = std::istream::tellg();
      std::istream::seekg((long)local_220,_S_beg);
      local_248 = 0x3fffffffffffffff;
      sVar3 = std::fpos::operator_cast_to_long((fpos *)local_240);
      bVar1 = true;
      if (-1 < sVar3) {
        sVar3 = std::fpos::operator_cast_to_long((fpos *)local_240);
        std::fpos<__mbstate_t>::fpos
                  (in_stack_fffffffffffffcd0,
                   CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
        sVar4 = std::fpos::operator_cast_to_long(local_258);
        bVar1 = sVar4 < sVar3;
      }
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"internal error: bad file length ");
        sVar3 = std::fpos::operator_cast_to_long((fpos *)local_240);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar3);
        poVar7 = std::operator<<(poVar7," for in-memory stream");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_1 = 1;
        local_230 = 1;
      }
      else {
        std::fpos::operator_cast_to_long((fpos *)local_240);
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   (allocator_type *)in_stack_fffffffffffffce0);
        std::allocator<char>::~allocator(local_271);
        pcVar5 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x10270e);
        std::fpos::operator_cast_to_long((fpos *)local_240);
        std::istream::read((char *)local_220,(long)pcVar5);
        lVar6 = std::istream::gcount();
        sVar3 = std::fpos::operator_cast_to_long((fpos *)local_240);
        if (lVar6 == sVar3) {
          pcVar5 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x102832);
          uVar8 = std::fpos::operator_cast_to_long((fpos *)local_240);
          local_1 = Imf_3_4::checkOpenEXRFile
                              (pcVar5,uVar8,(bool)(local_11 & 1),(bool)(local_12 & 1),
                               (bool)(local_14 & 1));
          local_1 = local_1 & 1;
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"internal error: failed to read file ");
          in_stack_fffffffffffffce0 = std::operator<<(poVar7,local_10);
          std::ostream::operator<<(in_stack_fffffffffffffce0,std::endl<char,std::char_traits<char>>)
          ;
          local_1 = 1;
        }
        local_230 = 1;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffce0);
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"internal error: bad file \'");
      poVar7 = std::operator<<(poVar7,local_10);
      poVar7 = std::operator<<(poVar7,"\' for in-memory stream");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_1 = 1;
      local_230 = 1;
    }
    std::ifstream::~ifstream(local_220);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool
exrCheck (
    const char* filename,
    bool        reduceMemory,
    bool        reduceTime,
    bool        useStream,
    bool        enableCoreCheck)
{
    if (useStream)
    {
        //
        // open file as stream, check size
        //
        ifstream instream (filename, ifstream::binary);

        if (!instream)
        {
            cerr << "internal error: bad file '" << filename
                 << "' for in-memory stream" << endl;
            return true;
        }

        instream.seekg (0, instream.end);
        streampos length = instream.tellg ();
        instream.seekg (0, instream.beg);

        const uintptr_t kMaxSize = uintptr_t (-1) / 4;
        if (length < 0 || length > (streampos) kMaxSize)
        {
            cerr << "internal error: bad file length " << length
                 << " for in-memory stream" << endl;
            return true;
        }

        //
        // read into memory
        //
        vector<char> data (length);
        instream.read (data.data (), length);
        if (instream.gcount () != length)
        {
            cerr << "internal error: failed to read file " << filename << endl;
            return true;
        }
        return checkOpenEXRFile (
            data.data (), length, reduceMemory, reduceTime, enableCoreCheck);
    }
    else
    {
        return checkOpenEXRFile (
            filename, reduceMemory, reduceTime, enableCoreCheck);
    }
}